

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  bool bVar2;
  TimeAlloc timeCnt;
  code *local_158 [2];
  code *local_148;
  code *local_140;
  ThreadPool threadPool;
  
  timeCnt.m_startTime = time((time_t *)0x0);
  ThreadPool::ThreadPool(&threadPool,100);
  ThreadPool::Start(&threadPool,2);
  iVar1 = 10000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_158[1] = (code *)0x0;
    local_158[0] = SayHelloWorld;
    local_140 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
    local_148 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
    ThreadPool::Run(&threadPool,(CallFunc *)local_158);
    std::_Function_base::~_Function_base((_Function_base *)local_158);
  }
  ThreadPool::~ThreadPool(&threadPool);
  TimeAlloc::~TimeAlloc(&timeCnt);
  return 0;
}

Assistant:

int main()
{
	time_t startTime = time(NULL);
	TimeAlloc timeCnt(startTime);
	
	ThreadPool threadPool(100);
	threadPool.Start(2);
	for (int i = 0; i < 10000; ++i)
	{
		threadPool.Run(SayHelloWorld);
	}
}